

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *
bijectiveParameterization
          (vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
           *__return_storage_ptr__,Mesh *mesh,double error)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  Index IVar4;
  undefined1 (*pauVar5) [16];
  double *pdVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  VectorXd x;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> init_param;
  DenseStorage<double,__1,__1,_1,_0> local_88;
  DenseStorage<double,__1,__1,_1,_0> local_78;
  undefined1 (*local_68) [16];
  ulong uStack_60;
  pointer local_58;
  pointer pVStack_50;
  pointer local_48;
  undefined8 local_38;
  
  init((EVP_PKEY_CTX *)&local_58);
  lVar10 = (long)pVStack_50 - (long)local_58;
  uVar9 = lVar10 >> 2;
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  pauVar5 = (undefined1 (*) [16])local_88.m_data;
  if (uVar9 != 0) {
    free((void *)0x0);
    if (pVStack_50 == local_58) {
      local_88.m_data = (double *)0x0;
      pauVar5 = (undefined1 (*) [16])local_88.m_data;
    }
    else if ((uVar9 >> 0x3d != 0) ||
            (pauVar5 = (undefined1 (*) [16])malloc(lVar10 * 2), pauVar5 == (undefined1 (*) [16])0x0)
            ) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = std::streambuf::xsgetn;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_88.m_data = (double *)pauVar5;
  lVar10 = lVar10 >> 3;
  if (pVStack_50 != local_58) {
    lVar8 = 0;
    pauVar5 = (undefined1 (*) [16])local_88.m_data;
    do {
      uVar1 = *(undefined8 *)local_58[lVar8].values_._M_elems;
      dVar3 = (double)(float)((ulong)uVar1 >> 0x20);
      auVar2._8_4_ = SUB84(dVar3,0);
      auVar2._0_8_ = (double)(float)uVar1;
      auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
      *pauVar5 = auVar2;
      lVar8 = lVar8 + 1;
      pauVar5 = pauVar5 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
  }
  local_88.m_rows = uVar9;
  getAveLen(mesh,(VectorXd *)&local_88);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_78,&local_88);
  local_38 = 0x3f40624dd2f1a9fc;
  LBFGS((Mesh *)&local_68,(VectorXd *)mesh,(double *)&local_78);
  pauVar5 = local_68;
  IVar4 = local_88.m_rows;
  pdVar6 = local_88.m_data;
  local_68 = (undefined1 (*) [16])local_88.m_data;
  local_88.m_data = (double *)pauVar5;
  local_88.m_rows = uStack_60;
  uStack_60 = IVar4;
  free(pdVar6);
  free(local_78.m_data);
  if (pVStack_50 != local_58) {
    lVar8 = 0;
    pdVar6 = local_88.m_data;
    do {
      *(ulong *)local_58[lVar8].values_._M_elems = CONCAT44((float)pdVar6[1],(float)*pdVar6);
      lVar8 = lVar8 + 1;
      pdVar6 = pdVar6 + 2;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
  }
  (__return_storage_ptr__->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = pVStack_50;
  (__return_storage_ptr__->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  local_58 = (pointer)0x0;
  pVStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  free(local_88.m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<OpenMesh::Vec2f> bijectiveParameterization(Mesh& mesh, double error) {
    auto init_param = init(mesh); // the initial parameterization for the mesh
    Eigen::VectorXd x(init_param.size() * 2);
    for (int i = 0; i < init_param.size(); ++i) {
        x[2 * i] = init_param[i][0];
        x[2 * i + 1] = init_param[i][1];
    }

    auto epsilon = getAveLen(mesh, x) * 0.25;
    // std::cerr << checkCreterion(mesh, x, epsilon) << std::endl;
    x = LBFGS(mesh, x, 0.0005); // optimize the parameterization using Quasi Newton Method

    // copy the result into a vector
    for (int i = 0; i < init_param.size(); ++i) {
        init_param[i][0] = x[2 * i];
        init_param[i][1] = x[2 * i + 1];
    }

    return std::move(init_param);
}